

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O3

bool Limonp::Logger::Logging(uint level,string *msg,char *fileName,int lineNo)

{
  tm *__tp;
  size_t sVar1;
  bool bVar2;
  time_t timeNow;
  char buf [1024];
  time_t local_440;
  char local_438 [1032];
  
  if (level < 5) {
    time(&local_440);
    __tp = localtime(&local_440);
    sVar1 = strftime(local_438,0x400,"%Y-%m-%d %H:%M:%S",__tp);
    bVar2 = sVar1 != 0;
    if (sVar1 == 0) {
      Logging((Logger *)_stderr);
    }
    else {
      fprintf(_stderr,"%s %s:%d %s %s\n",local_438,fileName,(ulong)(uint)lineNo,
              _ZN6LimonpL15LOG_LEVEL_ARRAYE_rel +
              *(int *)(_ZN6LimonpL15LOG_LEVEL_ARRAYE_rel + (ulong)level * 4),(msg->_M_dataplus)._M_p
             );
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"level\'s value is out of range",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool Logging(uint level, const string& msg, const char* fileName, int lineNo)
            {
                if(level > LL_FATAL)
                {
                    cerr<<"level's value is out of range"<<endl;
                    return false;
                }
                char buf[CSTR_BUFFER_SIZE];
                time_t timeNow;
                time(&timeNow);
                size_t ret = strftime(buf, sizeof(buf), LOG_TIME_FORMAT, localtime(&timeNow));
                if(0 == ret)
                {
                    fprintf(stderr, "stftime failed.\n");
                    return false;
                }
                fprintf(stderr, LOG_FORMAT, buf, fileName, lineNo,LOG_LEVEL_ARRAY[level], msg.c_str());
                return true;
            }